

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qobject_p.h
# Opt level: O0

Connection
QObjectPrivate::connect<void(QStyleHints::*)(int),void(QWidgetTextControlPrivate::*)()>
          (Object *sender,offset_in_QStyleHints_to_subr signal,Object *receiverPrivate,Function slot
          ,ConnectionType type)

{
  QObject *pQVar1;
  void *pvVar2;
  QPrivateSlotObject<void_(QWidgetTextControlPrivate::*)(),_QtPrivate::List<>,_void> *in_RSI;
  QObject *in_RDI;
  int in_R9D;
  long in_FS_OFFSET;
  int *types;
  undefined4 in_stack_ffffffffffffff4c;
  Function in_stack_ffffffffffffff50;
  QMetaObject *local_60;
  QSlotObjectBase local_28;
  QObject local_18 [16];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_60 = (QMetaObject *)0x0;
  if ((in_R9D == 2) || (in_R9D == 3)) {
    local_60 = (QMetaObject *)QtPrivate::ConnectionTypes<QtPrivate::List<int>,_true>::types();
  }
  pQVar1 = QtPrivate::getQObject((QObjectPrivate *)0x7244ce);
  pvVar2 = operator_new(0x20);
  QtPrivate::QPrivateSlotObject<void_(QWidgetTextControlPrivate::*)(),_QtPrivate::List<>,_void>::
  QPrivateSlotObject(in_RSI,in_stack_ffffffffffffff50);
  QObject::connectImpl
            (in_RDI,(void **)in_RSI,local_18,(void **)pQVar1,&local_28,(ConnectionType)pvVar2,
             (int *)CONCAT44(in_stack_ffffffffffffff4c,in_R9D),local_60);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return (Connection)in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

inline QMetaObject::Connection QObjectPrivate::connect(const typename QtPrivate::FunctionPointer<Func1>::Object *sender, Func1 signal,
                                                       const typename QtPrivate::FunctionPointer<Func2>::Object *receiverPrivate, Func2 slot,
                                                       Qt::ConnectionType type)
{
    typedef QtPrivate::FunctionPointer<Func1> SignalType;
    typedef QtPrivate::FunctionPointer<Func2> SlotType;
    static_assert(QtPrivate::HasQ_OBJECT_Macro<typename SignalType::Object>::Value,
                      "No Q_OBJECT in the class with the signal");

    //compilation error if the arguments does not match.
    static_assert(int(SignalType::ArgumentCount) >= int(SlotType::ArgumentCount),
                      "The slot requires more arguments than the signal provides.");
    static_assert((QtPrivate::CheckCompatibleArguments<typename SignalType::Arguments, typename SlotType::Arguments>::value),
                      "Signal and slot arguments are not compatible.");
    static_assert((QtPrivate::AreArgumentsCompatible<typename SlotType::ReturnType, typename SignalType::ReturnType>::value),
                      "Return type of the slot is not compatible with the return type of the signal.");

    const int *types = nullptr;
    if (type == Qt::QueuedConnection || type == Qt::BlockingQueuedConnection)
        types = QtPrivate::ConnectionTypes<typename SignalType::Arguments>::types();

    return QObject::connectImpl(sender, reinterpret_cast<void **>(&signal),
        QtPrivate::getQObject(receiverPrivate), reinterpret_cast<void **>(&slot),
        new QtPrivate::QPrivateSlotObject<Func2, typename QtPrivate::List_Left<typename SignalType::Arguments, SlotType::ArgumentCount>::Value,
                                        typename SignalType::ReturnType>(slot),
        type, types, &SignalType::Object::staticMetaObject);
}